

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O2

void __thiscall
FPNGTexture::FPNGTexture
          (FPNGTexture *this,FileReader *lump,int lumpnum,FString *filename,int width,int height,
          BYTE depth,BYTE colortype,BYTE interlace)

{
  undefined1 *puVar1;
  ushort uVar2;
  ushort uVar3;
  DWORD DVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  BYTE *pBVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  DWORD id;
  DWORD len;
  int local_554;
  BYTE **local_550;
  DWORD hoty;
  DWORD hotx;
  FString *local_540;
  BYTE trans [256];
  undefined4 uStack_434;
  anon_union_1024_2_8a3eb4f6 p;
  
  local_554 = lumpnum;
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPNGTexture_007e6c40;
  local_540 = &this->SourceFile;
  FString::AttachToOther(local_540,filename);
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->BitDepth = depth;
  this->ColorType = colortype;
  this->Interlace = interlace;
  this->HaveTrans = false;
  this->PaletteMap = (BYTE *)0x0;
  this->PaletteSize = 0;
  this->StartOfIDAT = 0;
  (this->super_FTexture).UseType = '\b';
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  puVar1 = &(this->super_FTexture).field_0x31;
  *puVar1 = *puVar1 & 0xf7;
  (this->super_FTexture).Width = (WORD)width;
  (this->super_FTexture).Height = (WORD)height;
  FTexture::CalcBitSize(&this->super_FTexture);
  memset(trans,0xff,0x100);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0x21,0);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&len,4);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&id,4);
  local_550 = &this->PaletteMap;
  while ((id != 0x444e4549 && (id != 0x54414449))) {
    len = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    if (id == 0x45544c50) {
      uVar5 = len / 3;
      if (0xff < uVar5) {
        uVar5 = 0x100;
      }
      this->PaletteSize = uVar5;
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&p,(ulong)(uVar5 * 3));
      uVar5 = this->PaletteSize;
      uVar12 = len + uVar5 * -3;
      if (uVar12 != 0) {
        (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,(ulong)uVar12,1);
        uVar5 = this->PaletteSize;
      }
      uVar8 = (ulong)uVar5;
      lVar10 = uVar8 * 3;
      for (; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
        (&uStack_434)[uVar8] =
             (uint)*(byte *)((long)&uStack_434 + lVar10 + 3) |
             (uint)*(byte *)((long)&uStack_434 + lVar10 + 2) << 8 |
             (uint)*(byte *)((long)&uStack_434 + lVar10 + 1) << 0x10;
        lVar10 = lVar10 + -3;
      }
    }
    else if (id == 0x534e5274) {
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,trans);
      this->HaveTrans = true;
      this->NonPaletteTrans[0] = trans._0_2_ << 8 | (ushort)trans._0_2_ >> 8;
      this->NonPaletteTrans[1] = trans._2_2_ << 8 | (ushort)trans._2_2_ >> 8;
      this->NonPaletteTrans[2] = trans._4_2_ << 8 | (ushort)trans._4_2_ >> 8;
    }
    else if (id == 0x62417267) {
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&hotx,4);
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&hoty,4);
      DVar4 = hoty;
      uVar5 = hotx >> 0x18 | (hotx & 0xff0000) >> 8;
      uVar12 = uVar5 | (hotx & 0xff00) << 8 | hotx << 0x18;
      if ((int)(short)uVar5 != uVar12) {
        pcVar7 = FWadCollection::GetLumpFullName(&Wads,local_554);
        Printf("X-Offset for PNG texture %s is bad: %d (0x%08x)\n",pcVar7,(ulong)uVar12,
               (ulong)uVar12);
        uVar12 = 0;
      }
      uVar5 = DVar4 >> 0x18 | (DVar4 & 0xff0000) >> 8;
      uVar11 = uVar5 | (DVar4 & 0xff00) << 8 | DVar4 << 0x18;
      if ((int)(short)uVar5 != uVar11) {
        pcVar7 = FWadCollection::GetLumpFullName(&Wads,local_554);
        Printf("Y-Offset for PNG texture %s is bad: %d (0x%08x)\n",pcVar7,(ulong)uVar11,
               (ulong)uVar11);
        uVar11 = 0;
      }
      (this->super_FTexture).LeftOffset = (SWORD)uVar12;
      (this->super_FTexture).TopOffset = (SWORD)uVar11;
    }
    else if (id == 0x68506c61) {
      puVar1 = &(this->super_FTexture).field_0x31;
      *puVar1 = *puVar1 | 0x18;
    }
    else {
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,(ulong)len,1);
    }
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,4,1);
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&len,4);
    id = 0x444e4549;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&id,4);
  }
  iVar6 = (*(lump->super_FileReaderBase)._vptr_FileReaderBase[3])(lump);
  this->StartOfIDAT = iVar6 - 8;
  switch(colortype) {
  case '\0':
    uVar3 = *(ushort *)&(this->super_FTexture).field_0x31;
    if ((uVar3 & 0x10) != 0) {
      return;
    }
    if (((colortype == '\0') && (this->HaveTrans == true)) &&
       (uVar2 = this->NonPaletteTrans[0], (ulong)uVar2 < 0x100)) {
      *(ushort *)&(this->super_FTexture).field_0x31 = uVar3 | 8;
      this->PaletteSize = 0x100;
      pBVar9 = (BYTE *)operator_new__(0x100);
      *local_550 = pBVar9;
      memcpy(pBVar9,FTexture::GrayMap,0x100);
      pBVar9[uVar2] = '\0';
      return;
    }
    goto LAB_005a68ed;
  case '\x02':
    *(ushort *)&(this->super_FTexture).field_0x31 =
         (*(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7) + (ushort)this->HaveTrans * 8;
    break;
  case '\x03':
    iVar6 = this->PaletteSize;
    pBVar9 = (BYTE *)operator_new__((long)iVar6);
    *local_550 = pBVar9;
    FPalette::MakeRemap(&GPalette,p.palette,pBVar9,trans,iVar6);
    for (lVar10 = 0; lVar10 < this->PaletteSize; lVar10 = lVar10 + 1) {
      if (trans[lVar10] == '\0') {
        puVar1 = &(this->super_FTexture).field_0x31;
        *puVar1 = *puVar1 | 8;
        this->PaletteMap[lVar10] = '\0';
      }
    }
    break;
  case '\x04':
    uVar3 = *(ushort *)&(this->super_FTexture).field_0x31;
    *(ushort *)&(this->super_FTexture).field_0x31 = uVar3 | 8;
    if ((uVar3 & 0x10) != 0) {
      return;
    }
LAB_005a68ed:
    *local_550 = FTexture::GrayMap;
    break;
  case '\x06':
    puVar1 = &(this->super_FTexture).field_0x31;
    *puVar1 = *puVar1 | 8;
  }
  return;
}

Assistant:

FPNGTexture::FPNGTexture (FileReader &lump, int lumpnum, const FString &filename, int width, int height,
						  BYTE depth, BYTE colortype, BYTE interlace)
: FTexture(NULL, lumpnum), SourceFile(filename), Pixels(0), Spans(0),
  BitDepth(depth), ColorType(colortype), Interlace(interlace), HaveTrans(false),
  PaletteMap(0), PaletteSize(0), StartOfIDAT(0)
{
	union
	{
		DWORD palette[256];
		BYTE pngpal[256][3];
	} p;
	BYTE trans[256];
	DWORD len, id;
	int i;

	UseType = TEX_MiscPatch;
	LeftOffset = 0;
	TopOffset = 0;
	bMasked = false;

	Width = width;
	Height = height;
	CalcBitSize ();

	memset(trans, 255, 256);

	// Parse pre-IDAT chunks. I skip the CRCs. Is that bad?
	lump.Seek(33, SEEK_SET);

	lump.Read(&len, 4);
	lump.Read(&id, 4);
	while (id != MAKE_ID('I','D','A','T') && id != MAKE_ID('I','E','N','D'))
	{
		len = BigLong((unsigned int)len);
		switch (id)
		{
		default:
			lump.Seek (len, SEEK_CUR);
			break;

		case MAKE_ID('g','r','A','b'):
			// This is like GRAB found in an ILBM, except coordinates use 4 bytes
			{
				DWORD hotx, hoty;
				int ihotx, ihoty;
				
				lump.Read(&hotx, 4);
				lump.Read(&hoty, 4);
				ihotx = BigLong((int)hotx);
				ihoty = BigLong((int)hoty);
				if (ihotx < -32768 || ihotx > 32767)
				{
					Printf ("X-Offset for PNG texture %s is bad: %d (0x%08x)\n", Wads.GetLumpFullName (lumpnum), ihotx, ihotx);
					ihotx = 0;
				}
				if (ihoty < -32768 || ihoty > 32767)
				{
					Printf ("Y-Offset for PNG texture %s is bad: %d (0x%08x)\n", Wads.GetLumpFullName (lumpnum), ihoty, ihoty);
					ihoty = 0;
				}
				LeftOffset = ihotx;
				TopOffset = ihoty;
			}
			break;

		case MAKE_ID('P','L','T','E'):
			PaletteSize = MIN<int> (len / 3, 256);
			lump.Read (p.pngpal, PaletteSize * 3);
			if (PaletteSize * 3 != (int)len)
			{
				lump.Seek (len - PaletteSize * 3, SEEK_CUR);
			}
			for (i = PaletteSize - 1; i >= 0; --i)
			{
				p.palette[i] = MAKERGB(p.pngpal[i][0], p.pngpal[i][1], p.pngpal[i][2]);
			}
			break;

		case MAKE_ID('t','R','N','S'):
			lump.Read (trans, len);
			HaveTrans = true;
			// Save for colortype 2
			NonPaletteTrans[0] = WORD(trans[0] * 256 + trans[1]);
			NonPaletteTrans[1] = WORD(trans[2] * 256 + trans[3]);
			NonPaletteTrans[2] = WORD(trans[4] * 256 + trans[5]);
			break;

		case MAKE_ID('a','l','P','h'):
			bAlphaTexture = true;
			bMasked = true;
			break;
		}
		lump.Seek(4, SEEK_CUR);		// Skip CRC
		lump.Read(&len, 4);
		id = MAKE_ID('I','E','N','D');
		lump.Read(&id, 4);
	}
	StartOfIDAT = lump.Tell() - 8;

	switch (colortype)
	{
	case 4:		// Grayscale + Alpha
		bMasked = true;
		// intentional fall-through

	case 0:		// Grayscale
		if (!bAlphaTexture)
		{
			if (colortype == 0 && HaveTrans && NonPaletteTrans[0] < 256)
			{
				bMasked = true;
				PaletteSize = 256;
				PaletteMap = new BYTE[256];
				memcpy (PaletteMap, GrayMap, 256);
				PaletteMap[NonPaletteTrans[0]] = 0;
			}
			else
			{
				PaletteMap = GrayMap;
			}
		}
		break;

	case 3:		// Paletted
		PaletteMap = new BYTE[PaletteSize];
		GPalette.MakeRemap (p.palette, PaletteMap, trans, PaletteSize);
		for (i = 0; i < PaletteSize; ++i)
		{
			if (trans[i] == 0)
			{
				bMasked = true;
				PaletteMap[i] = 0;
			}
		}
		break;

	case 6:		// RGB + Alpha
		bMasked = true;
		break;

	case 2:		// RGB
		bMasked = HaveTrans;
		break;
	}
}